

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O1

void calc<float>(options2 *opt)

{
  string *psVar1;
  func<float> fVar2;
  bool bVar3;
  autodiff_fvar<float,_1UL> aVar4;
  int iVar5;
  int *piVar6;
  long *plVar7;
  ostream *poVar8;
  runtime_error *this;
  undefined8 uVar9;
  code *pcVar10;
  undefined *puVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> f0;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  fvar<float,_2UL> fVar20;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> b0;
  func<float> local_b8;
  float local_ac;
  undefined1 local_a8 [16];
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  float local_68;
  undefined4 uStack_64;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  double local_40;
  double local_38;
  double local_30;
  
  fVar2 = (func<float>)(opt->Jx)._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  *piVar6 = 0;
  fVar14 = strtof((char *)fVar2,(char **)&local_b8);
  if (local_b8 == fVar2) {
    std::__throw_invalid_argument("stof");
LAB_00129c24:
    std::__throw_invalid_argument("stof");
LAB_00129c30:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Temperature should be positive");
  }
  else {
    local_68 = fVar14;
    uStack_64 = extraout_XMM0_Db;
    if (*piVar6 == 0) {
LAB_001296a4:
      *piVar6 = iVar5;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_001296a4;
    }
    fVar2 = (func<float>)(opt->Jy)._M_dataplus._M_p;
    iVar5 = *piVar6;
    *piVar6 = 0;
    fVar14 = strtof((char *)fVar2,(char **)&local_b8);
    if (local_b8 == fVar2) goto LAB_00129c24;
    local_78 = fVar14;
    uStack_74 = extraout_XMM0_Db_00;
    if (*piVar6 == 0) {
LAB_001296e6:
      *piVar6 = iVar5;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_001296e6;
    }
    psVar1 = &opt->Tmin;
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) goto LAB_0012975a;
      fVar2 = (func<float>)(psVar1->_M_dataplus)._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) {
        std::__throw_invalid_argument("stof");
LAB_00129cf4:
        std::__throw_invalid_argument("stof");
LAB_00129d00:
        uVar9 = std::__throw_invalid_argument("stof");
        __cxa_free_exception(piVar6);
        _Unwind_Resume(uVar9);
      }
      local_ac = fVar14;
      if (*piVar6 == 0) {
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_0012975a;
      }
      fVar2 = (func<float>)(opt->Tmax)._M_dataplus._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) goto LAB_00129cf4;
      local_a8._0_4_ = fVar14;
      if (*piVar6 == 0) {
LAB_00129898:
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00129898;
      }
      fVar2 = (func<float>)(opt->dT)._M_dataplus._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) goto LAB_00129d00;
      fVar15 = (float)local_a8._0_4_;
      fVar18 = local_ac;
      if (*piVar6 == 0) {
LAB_001298e3:
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        fVar14 = (float)std::__throw_out_of_range("stof");
        goto LAB_001298e3;
      }
LAB_001298e5:
      lVar12 = std::cout;
      if ((0.0 <= fVar15) && (0.0 <= fVar18)) {
        if (fVar15 < fVar18) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    ((invalid_argument *)this,"Tmax should be larger than Tmin");
        }
        else {
          local_a8._0_4_ = fVar15;
          local_ac = fVar18;
          local_90 = fVar14;
          if (0.0 < fVar14) {
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
                 0x100;
            *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar12 + -0x18)) =
                 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# lattice: square\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# precision: ",0xd);
            plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n",0x20);
            local_30 = (double)local_90 * 0.0001 + (double)(float)local_a8._0_4_;
            local_58 = (double)local_ac;
            if (local_58 < local_30) {
              local_38 = (double)local_68;
              local_40 = (double)local_78;
              do {
                local_a8 = ZEXT416((uint)(1.0 / local_ac));
                auVar19._4_12_ = DAT_00171030._4_12_;
                auVar19._0_4_ = 1.0 / local_ac;
                fVar20.v._M_elems._0_8_ = auVar19._0_8_;
                fVar20.v._M_elems[2] = 0.0;
                fVar20 = ising::free_energy::square::
                         infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                                   ((square *)poVar8,local_68,local_78,fVar20);
                local_8c = fVar20.v._M_elems[2];
                local_88._8_4_ = extraout_XMM0_Dc;
                local_88._0_8_ = fVar20.v._M_elems._0_8_;
                local_88._12_4_ = extraout_XMM0_Dd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"inf inf ",8);
                poVar8 = std::ostream::_M_insert<double>(local_38);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                poVar8 = std::ostream::_M_insert<double>(local_40);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                poVar8 = std::ostream::_M_insert<double>(local_58);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                poVar8 = std::ostream::_M_insert<double>((double)(float)local_a8._0_4_);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                poVar8 = std::ostream::_M_insert<double>((double)(float)local_88._0_4_);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                local_58 = (double)CONCAT44(local_88._4_4_,local_88._4_4_);
                fStack_50 = (float)local_88._4_4_;
                fStack_4c = (float)local_88._4_4_;
                poVar8 = std::ostream::_M_insert<double>
                                   ((double)((float)local_a8._0_4_ * (float)local_88._4_4_ +
                                            (float)local_88._0_4_));
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
                poVar8 = std::ostream::_M_insert<double>
                                   ((double)(-(float)local_a8._0_4_ * (float)local_a8._0_4_ *
                                            ((float)local_58 + (float)local_58 +
                                            (local_8c + local_8c) * (float)local_a8._0_4_)));
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                poVar8 = (ostream *)std::ostream::put((char)poVar8);
                std::ostream::flush();
                local_ac = local_ac + local_90;
                local_58 = (double)local_ac;
              } while (local_58 < local_30);
            }
            return;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument((invalid_argument *)this,"dT should be positive");
        }
        goto LAB_00129ca6;
      }
      goto LAB_00129c30;
    }
LAB_0012975a:
    auVar16._4_4_ = uStack_64;
    auVar16._0_4_ = local_68;
    auVar16._8_4_ = uStack_64;
    auVar16._12_4_ = uStack_74;
    auVar17._8_8_ = auVar16._8_8_;
    auVar17._4_4_ = local_78;
    auVar17._0_4_ = local_68;
    auVar17 = auVar17 & _DAT_00171020;
    if (0.0 < auVar17._0_4_ * auVar17._4_4_) {
      fVar14 = auVar17._4_4_ + auVar17._0_4_;
      fVar14 = 1.0 / (fVar14 + fVar14);
      local_a8 = ZEXT416((uint)fVar14);
      local_b8 = auVar17._0_8_;
      aVar4 = anon_unknown.dwarf_d4794::func<float>::operator()(&local_b8,fVar14);
      fVar14 = aVar4.v._M_elems[0];
      fVar15 = aVar4.v._M_elems[1];
      lVar12 = 0xff;
      do {
        local_88 = local_a8;
        local_a8._0_4_ = (float)local_a8._0_4_ - fVar14 / fVar15;
        aVar4 = anon_unknown.dwarf_d4794::func<float>::operator()(&local_b8,(float)local_a8._0_4_);
        fVar14 = aVar4.v._M_elems[0];
        fVar15 = aVar4.v._M_elems[1];
        bVar3 = ABS((float)local_a8._0_4_ - (float)local_88._0_4_) <
                (ABS((float)local_88._0_4_) + ABS((float)local_88._0_4_)) * 1.1920929e-07;
        bVar13 = lVar12 != 0;
        lVar12 = lVar12 + -1;
        if (ABS(fVar14) < 2.3841858e-07 || bVar3) break;
      } while (bVar13);
      if (ABS(fVar14) >= 2.3841858e-07 && !bVar3) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"convergence error");
        puVar11 = &std::runtime_error::typeinfo;
        pcVar10 = std::runtime_error::~runtime_error;
        goto LAB_00129cb4;
      }
      fVar14 = 1.0 / (float)local_a8._0_4_;
      fVar15 = fVar14;
      fVar18 = fVar14;
      goto LAB_001298e5;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Jx * Jy should be non-zero");
  }
LAB_00129ca6:
  puVar11 = &std::invalid_argument::typeinfo;
  pcVar10 = std::invalid_argument::~invalid_argument;
LAB_00129cb4:
  __cxa_throw(this,puVar11,pcVar10);
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}